

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::AlpsNewCodepointTest_ClientDefaultServerExplicit_Test::
~AlpsNewCodepointTest_ClientDefaultServerExplicit_Test
          (AlpsNewCodepointTest_ClientDefaultServerExplicit_Test *this)

{
  AlpsNewCodepointTest_ClientDefaultServerExplicit_Test *this_local;
  
  ~AlpsNewCodepointTest_ClientDefaultServerExplicit_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F(AlpsNewCodepointTest, ClientDefaultServerExplicit) {
  SetUpExpectedNewCodePoint(server_ctx_.get());

  ASSERT_TRUE(CreateClientAndServer(&client_, &server_, client_ctx_.get(),
                                    server_ctx_.get()));

  SSL_set_alps_use_new_codepoint(server_.get(), 1);

  SetUpApplicationSetting();
  ASSERT_TRUE(CompleteHandshakes(client_.get(), server_.get()));
  ASSERT_TRUE(SSL_has_application_settings(client_.get()));
}